

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_union(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  run_container_t *in_RDX;
  run_container_t *in_RSI;
  run_container_t *in_RDI;
  rle16_t newrl;
  rle16_t previousrle;
  int32_t xrlepos;
  int32_t rlepos;
  int32_t neededcapacity;
  _Bool if2;
  _Bool if1;
  run_container_t *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar4;
  rle16_t local_38;
  rle16_t local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 copy;
  int32_t in_stack_ffffffffffffffdc;
  int iVar5;
  undefined2 in_stack_ffffffffffffffe4;
  
  copy = (undefined1)((uint)in_stack_ffffffffffffffd8 >> 0x18);
  bVar1 = run_container_is_full(in_RDI);
  _Var2 = run_container_is_full(in_RSI);
  if (((bVar1 & 1) != 0) || (_Var2)) {
    if ((bVar1 & 1) != 0) {
      run_container_copy((run_container_t *)
                         CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      return;
    }
    if (_Var2) {
      run_container_copy((run_container_t *)
                         CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      return;
    }
  }
  iVar3 = in_RDI->n_runs + in_RSI->n_runs;
  if (in_RDX->capacity < iVar3) {
    run_container_grow((run_container_t *)
                       CONCAT17(bVar1,CONCAT16(_Var2,CONCAT24(in_stack_ffffffffffffffe4,iVar3))),
                       in_stack_ffffffffffffffdc,(_Bool)copy);
  }
  in_RDX->n_runs = 0;
  iVar5 = 0;
  iVar3 = 0;
  if (in_RSI->runs->value < in_RDI->runs->value) {
    local_2c = run_container_append_first(in_RDX,*in_RSI->runs);
    iVar3 = iVar3 + 1;
  }
  else {
    local_2c = run_container_append_first(in_RDX,*in_RDI->runs);
    iVar5 = iVar5 + 1;
  }
  while( true ) {
    bVar4 = false;
    if (iVar3 < in_RSI->n_runs) {
      bVar4 = iVar5 < in_RDI->n_runs;
    }
    if (!bVar4) break;
    if (in_RSI->runs[iVar3].value < in_RDI->runs[iVar5].value) {
      local_38 = in_RSI->runs[iVar3];
      iVar3 = iVar3 + 1;
    }
    else {
      local_38 = in_RDI->runs[iVar5];
      iVar5 = iVar5 + 1;
    }
    run_container_append(in_RDX,local_38,&local_2c);
  }
  for (; iVar3 < in_RSI->n_runs; iVar3 = iVar3 + 1) {
    run_container_append(in_RDX,in_RSI->runs[iVar3],&local_2c);
  }
  for (; iVar5 < in_RDI->n_runs; iVar5 = iVar5 + 1) {
    run_container_append(in_RDX,in_RDI->runs[iVar5],&local_2c);
  }
  return;
}

Assistant:

void run_container_union(const run_container_t *src_1,
                         const run_container_t *src_2, run_container_t *dst) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_1, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_2, dst);
            return;
        }
    }
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(dst, src_1->runs[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(dst, src_2->runs[xrlepos]);
        xrlepos++;
    }

    while ((xrlepos < src_2->n_runs) && (rlepos < src_1->n_runs)) {
        rle16_t newrl;
        if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = src_1->runs[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(dst, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(dst, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < src_1->n_runs) {
        run_container_append(dst, src_1->runs[rlepos], &previousrle);
        rlepos++;
    }
}